

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O2

float CombinedShannonEntropy_SSE2(int *X,int *Y)

{
  long lVar1;
  float fVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint local_4c;
  
  fVar2 = 0.0;
  local_4c = 0;
  uVar5 = 0;
  for (uVar4 = 0; uVar4 < 0x100; uVar4 = uVar4 + 0x10) {
    auVar9 = packssdw(*(undefined1 (*) [16])(X + uVar4),*(undefined1 (*) [16])(X + uVar4 + 4));
    auVar10 = packssdw(*(undefined1 (*) [16])(X + uVar4 + 8),*(undefined1 (*) [16])(X + uVar4 + 0xc)
                      );
    auVar9 = packsswb(auVar9,auVar10);
    auVar10 = packssdw(*(undefined1 (*) [16])(Y + uVar4),*(undefined1 (*) [16])(Y + uVar4 + 4));
    auVar11 = packssdw(*(undefined1 (*) [16])(Y + uVar4 + 8),*(undefined1 (*) [16])(Y + uVar4 + 0xc)
                      );
    auVar11 = packsswb(auVar10,auVar11);
    auVar10[0] = -('\0' < auVar9[0]);
    auVar10[1] = -('\0' < auVar9[1]);
    auVar10[2] = -('\0' < auVar9[2]);
    auVar10[3] = -('\0' < auVar9[3]);
    auVar10[4] = -('\0' < auVar9[4]);
    auVar10[5] = -('\0' < auVar9[5]);
    auVar10[6] = -('\0' < auVar9[6]);
    auVar10[7] = -('\0' < auVar9[7]);
    auVar10[8] = -('\0' < auVar9[8]);
    auVar10[9] = -('\0' < auVar9[9]);
    auVar10[10] = -('\0' < auVar9[10]);
    auVar10[0xb] = -('\0' < auVar9[0xb]);
    auVar10[0xc] = -('\0' < auVar9[0xc]);
    auVar10[0xd] = -('\0' < auVar9[0xd]);
    auVar10[0xe] = -('\0' < auVar9[0xe]);
    auVar10[0xf] = -('\0' < auVar9[0xf]);
    auVar9[0] = -('\0' < auVar11[0]);
    auVar9[1] = -('\0' < auVar11[1]);
    auVar9[2] = -('\0' < auVar11[2]);
    auVar9[3] = -('\0' < auVar11[3]);
    auVar9[4] = -('\0' < auVar11[4]);
    auVar9[5] = -('\0' < auVar11[5]);
    auVar9[6] = -('\0' < auVar11[6]);
    auVar9[7] = -('\0' < auVar11[7]);
    auVar9[8] = -('\0' < auVar11[8]);
    auVar9[9] = -('\0' < auVar11[9]);
    auVar9[10] = -('\0' < auVar11[10]);
    auVar9[0xb] = -('\0' < auVar11[0xb]);
    auVar9[0xc] = -('\0' < auVar11[0xc]);
    auVar9[0xd] = -('\0' < auVar11[0xd]);
    auVar9[0xe] = -('\0' < auVar11[0xe]);
    auVar9[0xf] = -('\0' < auVar11[0xf]);
    auVar9 = auVar9 | auVar10;
    for (uVar3 = (uint)(ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                               (ushort)(byte)(auVar9[0xf] >> 7) << 0xf); uVar3 != 0;
        uVar3 = uVar3 - 1 & uVar3) {
      uVar6 = 0;
      if (uVar3 != 0) {
        for (; (uVar3 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      lVar1 = uVar4 + uVar6;
      if (((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar10[0xf] >> 7) << 0xf) >> (uVar6 & 0x1f) & 1) != 0) {
        uVar6 = X[lVar1];
        if ((ulong)uVar6 < 0x100) {
          fVar7 = kSLog2Table[uVar6];
        }
        else {
          fVar7 = (*VP8LFastSLog2Slow)(uVar6);
        }
        local_4c = uVar6 + local_4c;
        fVar2 = fVar2 - fVar7;
      }
      uVar6 = Y[lVar1] + X[lVar1];
      if (uVar6 < 0x100) {
        fVar7 = kSLog2Table[uVar6];
      }
      else {
        fVar7 = (*VP8LFastSLog2Slow)(uVar6);
      }
      uVar5 = uVar5 + uVar6;
      fVar2 = fVar2 - fVar7;
    }
  }
  if (uVar5 < 0x100) {
    fVar7 = kSLog2Table[uVar5];
  }
  else {
    fVar7 = (*VP8LFastSLog2Slow)(uVar5);
  }
  if (local_4c < 0x100) {
    fVar8 = kSLog2Table[local_4c];
  }
  else {
    fVar8 = (*VP8LFastSLog2Slow)(local_4c);
  }
  return fVar2 + fVar7 + fVar8;
}

Assistant:

static float CombinedShannonEntropy_SSE2(const int X[256], const int Y[256]) {
  int i;
  double retval = 0.;
  int sumX = 0, sumXY = 0;
  const __m128i zero = _mm_setzero_si128();

  for (i = 0; i < 256; i += 16) {
    const __m128i x0 = _mm_loadu_si128((const __m128i*)(X + i +  0));
    const __m128i y0 = _mm_loadu_si128((const __m128i*)(Y + i +  0));
    const __m128i x1 = _mm_loadu_si128((const __m128i*)(X + i +  4));
    const __m128i y1 = _mm_loadu_si128((const __m128i*)(Y + i +  4));
    const __m128i x2 = _mm_loadu_si128((const __m128i*)(X + i +  8));
    const __m128i y2 = _mm_loadu_si128((const __m128i*)(Y + i +  8));
    const __m128i x3 = _mm_loadu_si128((const __m128i*)(X + i + 12));
    const __m128i y3 = _mm_loadu_si128((const __m128i*)(Y + i + 12));
    const __m128i x4 = _mm_packs_epi16(_mm_packs_epi32(x0, x1),
                                       _mm_packs_epi32(x2, x3));
    const __m128i y4 = _mm_packs_epi16(_mm_packs_epi32(y0, y1),
                                       _mm_packs_epi32(y2, y3));
    const int32_t mx = _mm_movemask_epi8(_mm_cmpgt_epi8(x4, zero));
    int32_t my = _mm_movemask_epi8(_mm_cmpgt_epi8(y4, zero)) | mx;
    while (my) {
      const int32_t j = BitsCtz(my);
      int xy;
      if ((mx >> j) & 1) {
        const int x = X[i + j];
        sumXY += x;
        retval -= VP8LFastSLog2(x);
      }
      xy = X[i + j] + Y[i + j];
      sumX += xy;
      retval -= VP8LFastSLog2(xy);
      my &= my - 1;
    }
  }
  retval += VP8LFastSLog2(sumX) + VP8LFastSLog2(sumXY);
  return (float)retval;
}